

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteBlock.cpp
# Opt level: O1

ByteBlock *
Js::ByteBlock::New(Recycler *alloc,byte *initialContent,int initialContentSize,
                  ScriptContext *requestContext)

{
  uchar *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Recycler *alloc_00;
  ByteBlock *this;
  Var addr;
  ulong uVar5;
  long lVar6;
  Var *src;
  undefined1 local_78 [8];
  TrackAllocData data;
  
  if (initialContentSize < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteBlock.cpp"
                                ,0x4f,"(initialContentSize > 0)","Must have valid data size");
    if (!bVar3) {
LAB_007f73c9:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  local_78 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_3530231;
  data.filename._0_4_ = 0x51;
  alloc_00 = Memory::Recycler::TrackAllocInfo(alloc,(TrackAllocData *)local_78);
  this = (ByteBlock *)new<Memory::Recycler>(0x10,alloc_00,0x38bbb2);
  ByteBlock(this,initialContentSize,alloc);
  if ((initialContent != (byte *)0x0) && (7 < (uint)initialContentSize)) {
    puVar1 = (this->m_content).ptr;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    data._32_8_ = ((ulong)(long)initialContentSize >> 3) +
                  (ulong)((ulong)(long)initialContentSize >> 3 == 0);
    lVar6 = 0;
    do {
      uVar5 = *(ulong *)(initialContent + lVar6 * 8) & 0xffff000000000000;
      if ((*(ulong *)(initialContent + lVar6 * 8) & 0x1ffff00000000) != 0x1000000000000 &&
          uVar5 == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) goto LAB_007f73c9;
        *puVar4 = 0;
      }
      if (uVar5 == 0x1000000000000) {
        *(ulong *)(puVar1 + lVar6 * 8) = *(ulong *)(initialContent + lVar6 * 8);
      }
      else {
        if (*(ulong *)(initialContent + lVar6 * 8) >> 0x32 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar4 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteBlock.cpp"
                                      ,0x6d,"(JavascriptNumber::Is(src[i]))",
                                      "JavascriptNumber::Is(src[i])");
          if (!bVar3) goto LAB_007f73c9;
          *puVar4 = 0;
        }
        addr = JavascriptNumber::CloneToScriptContext
                         (*(Var *)(initialContent + lVar6 * 8),requestContext);
        *(Var *)(puVar1 + lVar6 * 8) = addr;
        ScriptContext::BindReference(requestContext,addr);
      }
      lVar6 = lVar6 + 1;
    } while (data._32_8_ != lVar6);
  }
  return this;
}

Assistant:

ByteBlock *ByteBlock::New(Recycler *alloc, const byte * initialContent, int initialContentSize, ScriptContext * requestContext)
    {
        // initialContent may be 'null' if no data to copy
        AssertMsg(initialContentSize > 0, "Must have valid data size");

        ByteBlock *newBlock = RecyclerNew(alloc, ByteBlock, initialContentSize, alloc);

        //
        // Copy any optional data into the block:
        // - If initialContent was not provided, the block's contents will be uninitialized.
        //
        if (initialContent != nullptr)
        {
            //
            // Treat initialContent as array of vars
            // Clone vars to the requestContext
            //

            Var *src = (Var*)initialContent;
            Var *dst = (Var*)(byte*)newBlock->m_content;
            size_t count = initialContentSize / sizeof(Var);

            for (size_t i = 0; i < count; i++)
            {
                if (TaggedInt::Is(src[i]))
                {
                    dst[i] = src[i];
                }
                else
                {
                    //
                    // Currently only numbers are put into AuxiliaryContext data
                    //
                    Assert(JavascriptNumber::Is(src[i]));
                    dst[i] = JavascriptNumber::CloneToScriptContext(src[i], requestContext);
                    requestContext->BindReference(dst[i]);
                }
            }
        }

        return newBlock;
    }